

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void setup_frame_size(AV1_COMMON *cm,int frame_size_override_flag,aom_read_bit_buffer *rb)

{
  SequenceHeader *pSVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  int width;
  int height;
  int local_28;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  pSVar1 = cm->seq_params;
  if (frame_size_override_flag == 0) {
    local_28 = pSVar1->max_frame_width;
    local_24 = pSVar1->max_frame_height;
  }
  else {
    iVar4 = pSVar1->num_bits_height;
    iVar3 = aom_rb_read_literal(rb,pSVar1->num_bits_width);
    _local_28 = CONCAT44(local_24,iVar3 + 1);
    iVar4 = aom_rb_read_literal(rb,iVar4);
    local_24 = iVar4 + 1;
    if ((pSVar1->max_frame_width < local_28) || (pSVar1->max_frame_height <= iVar4)) {
      aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  }
  cm->superres_upscaled_width = local_28;
  cm->superres_upscaled_height = local_24;
  if (cm->seq_params->enable_superres != '\0') {
    iVar4 = aom_rb_read_bit(rb);
    if (iVar4 == 0) {
      cm->superres_scale_denominator = '\b';
    }
    else {
      iVar4 = aom_rb_read_literal(rb,3);
      bVar2 = (char)iVar4 + 9;
      cm->superres_scale_denominator = bVar2;
      av1_calculate_scaled_superres_size(&local_28,&local_24,(uint)bVar2);
    }
  }
  resize_context_buffers(cm,local_28,local_24);
  cm->render_width = cm->superres_upscaled_width;
  cm->render_height = cm->superres_upscaled_height;
  iVar4 = aom_rb_read_bit(rb);
  if (iVar4 != 0) {
    iVar4 = aom_rb_read_literal(rb,0x10);
    cm->render_width = iVar4 + 1;
    iVar4 = aom_rb_read_literal(rb,0x10);
    cm->render_height = iVar4 + 1;
  }
  setup_buffer_pool(cm);
  return;
}

Assistant:

static inline void setup_frame_size(AV1_COMMON *cm,
                                    int frame_size_override_flag,
                                    struct aom_read_bit_buffer *rb) {
  const SequenceHeader *const seq_params = cm->seq_params;
  int width, height;

  if (frame_size_override_flag) {
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;
    read_frame_size(rb, num_bits_width, num_bits_height, &width, &height);
    if (width > seq_params->max_frame_width ||
        height > seq_params->max_frame_height) {
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  } else {
    width = seq_params->max_frame_width;
    height = seq_params->max_frame_height;
  }

  setup_superres(cm, rb, &width, &height);
  resize_context_buffers(cm, width, height);
  setup_render_size(cm, rb);
  setup_buffer_pool(cm);
}